

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O0

int CaptureLeafPlain(void **stack,int stack_len)

{
  uint uVar1;
  int size;
  int stack_len_local;
  void **stack_local;
  
  expected_range[0].start = (void *)0x101743;
  expected_range[0].end = (void *)0x101801;
  uVar1 = GetStackTrace(stack,stack_len,0);
  printf("Obtained %d stack frames.\n",(ulong)uVar1);
  if ((int)uVar1 < 1) {
    fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stacktrace_unittest.cc"
            ,0xdd,"size",">=","1");
    abort();
  }
  if ((int)uVar1 <= stack_len) {
    return uVar1;
  }
  fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stacktrace_unittest.cc"
          ,0xde,"size","<=","stack_len");
  abort();
}

Assistant:

int ATTRIBUTE_NOINLINE CaptureLeafPlain(void **stack, int stack_len) {
  INIT_ADDRESS_RANGE(CheckStackTraceLeaf, start, end, &expected_range[0]);
  DECLARE_ADDRESS_LABEL(start);

  int size = GetStackTrace(stack, stack_len, 0);

  printf("Obtained %d stack frames.\n", size);
  CHECK_GE(size, 1);
  CHECK_LE(size, stack_len);

  DECLARE_ADDRESS_LABEL(end);

  return size;
}